

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getEvents_abi_cxx11_(Session *session,char *eventFormat)

{
  TestStream *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  Expression_lhs<unsigned_long> EVar1;
  Result *in_stack_00000030;
  char *in_stack_00000038;
  int in_stack_00000044;
  char *in_stack_00000048;
  Enum in_stack_00000054;
  TestStream *in_stack_00000058;
  Session *in_stack_00000060;
  ConsumeResult cr;
  TestStream stream;
  char *in_stack_00000270;
  TestStream *in_stack_00000278;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  TestStream *in_stack_ffffffffffffff20;
  ExpressionDecomposer local_a4;
  TestStream *local_a0;
  Enum local_98;
  unsigned_long *in_stack_ffffffffffffffa0;
  Expression_lhs<unsigned_long> *in_stack_ffffffffffffffa8;
  vector<char,_std::allocator<char>_> local_38 [2];
  
  TestStream::TestStream(in_stack_ffffffffffffff20);
  binlog::Session::consume<TestStream>(in_stack_00000060,in_stack_00000058);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_a4,DT_CHECK);
  std::vector<char,_std::allocator<char>_>::size(local_38);
  EVar1 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)in_stack_ffffffffffffff20,
                     (unsigned_long *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  this = (TestStream *)EVar1.lhs;
  local_98 = EVar1.m_at;
  local_a0 = this;
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  doctest::detail::decomp_assert
            (in_stack_00000054,in_stack_00000048,in_stack_00000044,in_stack_00000038,
             in_stack_00000030);
  doctest::detail::Result::~Result((Result *)0x26ef82);
  streamToEvents_abi_cxx11_(in_stack_00000278,in_stack_00000270);
  TestStream::~TestStream(this);
  return in_RDI;
}

Assistant:

std::vector<std::string> getEvents(binlog::Session& session, const char* eventFormat)
{
  TestStream stream;
  const binlog::Session::ConsumeResult cr = session.consume(stream);
  CHECK(stream.buffer.size() == cr.bytesConsumed);
  return streamToEvents(stream, eventFormat);
}